

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

bool __thiscall Memory::Recycler::DumpObjectGraph(Recycler *this,Param *param)

{
  ObservableValue<Memory::CollectionState> *pOVar1;
  CollectionState CVar2;
  ObservableValueObserver<Memory::CollectionState> *pOVar3;
  CollectionState CVar4;
  byte bVar5;
  char16_t *form;
  undefined1 local_7c8 [8];
  AutoSetupRecyclerForNonCollectingMark AutoSetupRecyclerForNonCollectingMark;
  RecyclerObjectGraphDumper objectGraphDumper;
  AutoRestoreValue<bool> skipStackToggle;
  DebugCheckNoException __debugCheckNoException;
  
  pOVar1 = &this->collectionState;
  CVar2 = (this->collectionState).value;
  CVar4 = CVar2;
  if (CVar2 == CollectionStateExit) {
    local_7c8._0_4_ = CollectionStateNotCollecting;
    pOVar3 = (this->collectionState).observer;
    if (pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) {
      (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,local_7c8,pOVar1);
    }
    pOVar1->value = local_7c8._0_4_;
    CVar4 = local_7c8._0_4_;
  }
  if (CVar4 == CollectionStateNotCollecting) {
    skipStackToggle._20_1_ = 1;
    skipStackToggle._16_4_ = ExceptionCheck::Save();
    RecyclerObjectGraphDumper::RecyclerObjectGraphDumper
              ((RecyclerObjectGraphDumper *)
               (AutoSetupRecyclerForNonCollectingMark.m_previousCollectionStats.numEmptySmallBlocks
               + 10),this,param);
    Recycler::AutoSetupRecyclerForNonCollectingMark::AutoSetupRecyclerForNonCollectingMark
              ((AutoSetupRecyclerForNonCollectingMark *)local_7c8,this,false);
    skipStackToggle._0_8_ = &this->skipStack;
    skipStackToggle.variable._0_1_ = this->skipStack;
    objectGraphDumper.dumpObjectIsArray = true;
    if ((bool)(char)skipStackToggle.variable == false) {
      if (param == (Param *)0x0) {
        objectGraphDumper.dumpObjectIsArray = false;
      }
      else {
        objectGraphDumper.dumpObjectIsArray = param->skipStack;
      }
    }
    this->skipStack = objectGraphDumper.dumpObjectIsArray;
    Mark(this);
    this->objectGraphDumper = (RecyclerObjectGraphDumper *)0x0;
    if (param != (Param *)0x0) {
      memcpy(&param->stats,&this->collectionStats,0x538);
    }
    AutoRestoreValue<bool>::~AutoRestoreValue
              ((AutoRestoreValue<bool> *)&objectGraphDumper.dumpObjectIsArray);
    Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark
              ((AutoSetupRecyclerForNonCollectingMark *)local_7c8);
    RecyclerObjectGraphDumper::~RecyclerObjectGraphDumper
              ((RecyclerObjectGraphDumper *)
               (AutoSetupRecyclerForNonCollectingMark.m_previousCollectionStats.numEmptySmallBlocks
               + 10));
    skipStackToggle._20_1_ = 0;
    DebugCheckNoException::~DebugCheckNoException
              ((DebugCheckNoException *)&skipStackToggle.oldValue);
    if (CVar2 == CollectionStateExit) {
      local_7c8._0_4_ = CollectionStateExit;
      pOVar3 = (this->collectionState).observer;
      if ((pOVar3 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
         ((this->collectionState).value != CollectionStateExit)) {
        (**pOVar3->_vptr_ObservableValueObserver)(pOVar3,local_7c8,pOVar1);
      }
      pOVar1->value = local_7c8._0_4_;
    }
    bVar5 = objectGraphDumper.dumpObjectTypeInfo._1_1_ ^ 1;
    if (objectGraphDumper.dumpObjectTypeInfo._1_1_ == 0) goto LAB_007098e2;
    form = L"Out of memory dumping object graph\n";
  }
  else {
    form = L"Can\'t dump object graph when collecting\n";
    bVar5 = 0;
  }
  Output::Print(form);
LAB_007098e2:
  Output::Flush();
  return (bool)bVar5;
}

Assistant:

bool Recycler::DumpObjectGraph(RecyclerObjectGraphDumper::Param * param)
{
    bool succeeded = false;
    bool isExited = (this->collectionState == CollectionStateExit);
    if (isExited)
    {
        this->SetCollectionState(CollectionStateNotCollecting);
    }
    if (this->collectionState != CollectionStateNotCollecting)
    {
        Output::Print(_u("Can't dump object graph when collecting\n"));
        Output::Flush();
        return succeeded;
    }
    BEGIN_NO_EXCEPTION
    {
        RecyclerObjectGraphDumper objectGraphDumper(this, param);

        Recycler::AutoSetupRecyclerForNonCollectingMark AutoSetupRecyclerForNonCollectingMark(*this);
        AutoRestoreValue<bool> skipStackToggle(&this->skipStack, this->skipStack || (param && param->skipStack));

        this->Mark();

        this->objectGraphDumper = nullptr;
#ifdef RECYCLER_STATS
        if (param)
        {
            param->stats = this->collectionStats;
        }
#endif
        succeeded = !objectGraphDumper.isOutOfMemory;
    }